

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_util.c
# Opt level: O0

int ossl_prov_digest_load_from_params(PROV_DIGEST *pd,OSSL_PARAM *params,OSSL_LIB_CTX *ctx)

{
  int iVar1;
  OSSL_LIB_CTX *libctx;
  EVP_MD *pEVar2;
  PROV_DIGEST *in_RDX;
  long in_RSI;
  long *in_RDI;
  EVP_MD *md;
  char *propquery;
  OSSL_PARAM *p;
  ENGINE **in_stack_ffffffffffffffc8;
  OSSL_PARAM *in_stack_ffffffffffffffd0;
  OSSL_PARAM *in_stack_ffffffffffffffd8;
  uint local_4;
  
  if (in_RSI == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = load_common(in_stack_ffffffffffffffd8,&in_stack_ffffffffffffffd0->key,
                        in_stack_ffffffffffffffc8);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      libctx = (OSSL_LIB_CTX *)
               OSSL_PARAM_locate_const(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
      if (libctx == (OSSL_LIB_CTX *)0x0) {
        local_4 = 1;
      }
      else if (*(uint *)&(libctx->data).ctx == 4) {
        ERR_set_mark();
        ossl_prov_digest_fetch
                  (in_RDX,libctx,(char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8
                  );
        if (((*in_RDI == 0) &&
            (pEVar2 = EVP_get_digestbyname((char *)(libctx->data).sk), pEVar2 != (EVP_MD *)0x0)) &&
           (*(int *)&pEVar2->init != 1)) {
          *in_RDI = (long)pEVar2;
        }
        if (*in_RDI == 0) {
          ERR_clear_last_mark();
        }
        else {
          ERR_pop_to_mark();
        }
        local_4 = (uint)(*in_RDI != 0);
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int ossl_prov_digest_load_from_params(PROV_DIGEST *pd,
                                      const OSSL_PARAM params[],
                                      OSSL_LIB_CTX *ctx)
{
    const OSSL_PARAM *p;
    const char *propquery;

    if (params == NULL)
        return 1;

    if (!load_common(params, &propquery, &pd->engine))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_ALG_PARAM_DIGEST);
    if (p == NULL)
        return 1;
    if (p->data_type != OSSL_PARAM_UTF8_STRING)
        return 0;

    ERR_set_mark();
    ossl_prov_digest_fetch(pd, ctx, p->data, propquery);
#ifndef FIPS_MODULE /* Inside the FIPS module, we don't support legacy digests */
    if (pd->md == NULL) {
        const EVP_MD *md;

        md = EVP_get_digestbyname(p->data);
        /* Do not use global EVP_MDs */
        if (md != NULL && md->origin != EVP_ORIG_GLOBAL)
            pd->md = md;
    }
#endif
    if (pd->md != NULL)
        ERR_pop_to_mark();
    else
        ERR_clear_last_mark();
    return pd->md != NULL;
}